

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O1

string * anurbs::NurbsCurveGeometry<2l>::python_name_abi_cxx11_(void)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  size_type *psVar4;
  string *in_RDI;
  string __str;
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  long *local_38 [2];
  long local_28 [2];
  
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct((ulong)local_38,'\x01');
  *(undefined1 *)local_38[0] = 0x32;
  plVar2 = (long *)std::__cxx11::string::replace((ulong)local_38,0,(char *)0x0,0x2f1871);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_48 = *plVar3;
    lStack_40 = plVar2[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar3;
    local_58 = (long *)*plVar2;
  }
  local_50 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar4) {
    lVar1 = plVar2[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
    *(long *)((long)&in_RDI->field_2 + 8) = lVar1;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*plVar2;
    (in_RDI->field_2)._M_allocated_capacity = *psVar4;
  }
  in_RDI->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != &local_48) {
    operator_delete(local_58,local_48 + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

static std::string python_name()
    {
        return "NurbsCurveGeometry" + std::to_string(dimension()) + "D";
    }